

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsNetId.cpp
# Opt level: O2

void __thiscall AmsNetId::AmsNetId(AmsNetId *this,string *addr)

{
  int iVar1;
  istream *piVar2;
  long lVar3;
  string s;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)addr,_S_in);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss,(string *)&s,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_001325fb;
    iVar1 = atoi(s._M_dataplus._M_p);
    this->b[lVar3] = (uint8_t)iVar1;
  }
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)&iss,(string *)&s,'.');
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
LAB_001325fb:
    if (AmsNetId(std::__cxx11::string_const&)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&AmsNetId(std::__cxx11::string_const&)::empty);
      if (iVar1 != 0) {
        AmsNetId(&AmsNetId::empty,0);
        __cxa_guard_release(&AmsNetId(std::__cxx11::string_const&)::empty);
      }
    }
    *(undefined2 *)(this->b + 4) = AmsNetId::empty.b._4_2_;
    *(undefined4 *)this->b = AmsNetId::empty.b._0_4_;
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return;
}

Assistant:

AmsNetId::AmsNetId(const std::string& addr)
{
    std::istringstream iss(addr);
    std::string s;
    size_t i = 0;

    while ((i < sizeof(b)) && std::getline(iss, s, '.')) {
        b[i] = atoi(s.c_str()) % 256;
        ++i;
    }

    if ((i != sizeof(b)) || std::getline(iss, s, '.')) {
        static const AmsNetId empty {};
        memcpy(b, empty.b, sizeof(b));
    }
}